

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplers.cpp
# Opt level: O2

vector<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_> * __thiscall
pbrt::PMJ02BNSampler::Clone
          (vector<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_> *__return_storage_ptr__
          ,PMJ02BNSampler *this,int n,Allocator alloc)

{
  undefined8 *puVar1;
  undefined8 uVar2;
  vector<pbrt::Point2<float>,_pstd::pmr::polymorphic_allocator<pbrt::Point2<float>_>_> *pvVar3;
  Tuple2<pbrt::Point2,_int> TVar4;
  PMJ02BNSampler *pPVar5;
  pointer pSVar6;
  long lVar7;
  allocator_type local_31;
  polymorphic_allocator<std::byte> local_30;
  
  local_30.memoryResource = alloc.memoryResource;
  std::vector<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_>::vector
            (__return_storage_ptr__,(long)n,&local_31);
  pPVar5 = pstd::pmr::polymorphic_allocator<std::byte>::allocate_object<pbrt::PMJ02BNSampler>
                     (&local_30,(long)n);
  pSVar6 = (__return_storage_ptr__->
           super__Vector_base<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_>)._M_impl.
           super__Vector_impl_data._M_start;
  for (lVar7 = 0; (ulong)(uint)(~(n >> 0x1f) & n) * 0x28 - lVar7 != 0; lVar7 = lVar7 + 0x28) {
    *(undefined8 *)((long)&pPVar5->sampleIndex + lVar7) = *(undefined8 *)&this->sampleIndex;
    uVar2 = *(undefined8 *)&this->pixelTileSize;
    pvVar3 = this->pixelSamples;
    TVar4 = (this->pixel).super_Tuple2<pbrt::Point2,_int>;
    puVar1 = (undefined8 *)((long)&pPVar5->samplesPerPixel + lVar7);
    *puVar1 = *(undefined8 *)this;
    puVar1[1] = uVar2;
    puVar1[2] = pvVar3;
    *(Tuple2<pbrt::Point2,_int> *)(puVar1 + 3) = TVar4;
    (pSVar6->
    super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
    ).bits = (long)&pPVar5->samplesPerPixel + lVar7 | 0x7000000000000;
    pSVar6 = pSVar6 + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<SamplerHandle> PMJ02BNSampler::Clone(int n, Allocator alloc) {
    std::vector<SamplerHandle> samplers(n);
    PMJ02BNSampler *samplerMem =
        (PMJ02BNSampler *)alloc.allocate_object<PMJ02BNSampler>(n);
    for (int i = 0; i < n; ++i) {
        alloc.construct(&samplerMem[i], *this);
        samplers[i] = &samplerMem[i];
    }
    return samplers;
}